

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxAbsNzo(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool unscaled)

{
  int iVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  m;
  cpp_dec_float<50U,_int,_void> local_60;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,0.0);
  if (((int)CONCAT71(in_register_00000011,unscaled) == 0) || (this->_isScaled != true)) {
    if (0 < (this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      lVar4 = 0;
      do {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_60,
                 (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)((this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem +
                    (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey[lVar4].idx));
        if (((local_60.fpclass != cpp_dec_float_NaN) &&
            ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar1 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_60,&__return_storage_ptr__->m_backend), 0 < iVar1)) {
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
               local_60.data._M_elems._32_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
               local_60.data._M_elems._16_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
               local_60.data._M_elems._24_8_;
          *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
               local_60.data._M_elems._0_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
               local_60.data._M_elems._8_8_;
          (__return_storage_ptr__->m_backend).exp = local_60.exp;
          (__return_storage_ptr__->m_backend).neg = local_60.neg;
          (__return_storage_ptr__->m_backend).fpclass = local_60.fpclass;
          (__return_storage_ptr__->m_backend).prec_elem = local_60.prec_elem;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
    }
  }
  else if (0 < (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum) {
    uVar3 = 0;
    do {
      (*this->lp_scaler->_vptr_SPxScaler[0x12])(&local_60,this->lp_scaler,this,uVar3);
      if (((local_60.fpclass != cpp_dec_float_NaN) &&
          ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar1 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_60,&__return_storage_ptr__->m_backend), 0 < iVar1)) {
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
             local_60.data._M_elems._32_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
             local_60.data._M_elems._16_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
             local_60.data._M_elems._24_8_;
        *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
             local_60.data._M_elems._0_8_;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
             local_60.data._M_elems._8_8_;
        (__return_storage_ptr__->m_backend).exp = local_60.exp;
        (__return_storage_ptr__->m_backend).neg = local_60.neg;
        (__return_storage_ptr__->m_backend).fpclass = local_60.fpclass;
        (__return_storage_ptr__->m_backend).prec_elem = local_60.prec_elem;
      }
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
    } while ((int)uVar2 <
             (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  }
  return __return_storage_ptr__;
}

Assistant:

inline
R SPxLPBase<R>::maxAbsNzo(bool unscaled) const
{
   R maxi = 0.0;

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMaxAbsUnscaled(*this, i);

         if(m > maxi)
            maxi = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).maxAbs();

         if(m > maxi)
            maxi = m;
      }
   }

   assert(maxi >= 0.0);

   return maxi;
}